

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_CallFlowGraph.h
# Opt level: O1

void soul::CallFlowGraph::iterateCallSequences
               (Function *f,CallSequenceCheckResults *results,PreviousCall *previous,
               uint64_t stackSize)

{
  pointer ppVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  Statement *pSVar5;
  pointer ppVar6;
  ulong stackSize_00;
  PreviousCall newPrevious;
  PreviousCall local_40;
  
  calculateLocalVariableStackSize(f);
  stackSize_00 = stackSize + f->localVariableStackSize + 0x10;
  uVar3 = results->maximumStackSize;
  if (results->maximumStackSize <= stackSize_00) {
    uVar3 = stackSize_00;
  }
  results->maximumStackSize = uVar3;
  local_40.previous = previous;
  local_40.function = f;
  if ((previous == (PreviousCall *)0x0) || (bVar2 = PreviousCall::contains(previous,f), !bVar2)) {
    ppVar1 = (f->blocks).
             super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar6 = (f->blocks).
                  super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar1; ppVar6 = ppVar6 + 1)
    {
      for (pSVar5 = (ppVar6->object->statements).firstObject; pSVar5 != (Statement *)0x0;
          pSVar5 = pSVar5->nextObject) {
        lVar4 = __dynamic_cast(pSVar5,&heart::Statement::typeinfo,&heart::FunctionCall::typeinfo,0);
        if (lVar4 != 0) {
          if (*(Function **)(lVar4 + 0x28) == (Function *)0x0) {
            throwInternalCompilerError("object != nullptr","operator*",0x3b);
          }
          iterateCallSequences(*(Function **)(lVar4 + 0x28),results,&local_40,stackSize_00);
        }
      }
    }
  }
  else if ((results->recursiveFunctionCallSequence).
           super__Vector_base<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (results->recursiveFunctionCallSequence).
           super__Vector_base<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
    PreviousCall::findCallSequenceUpTo(previous,f,&results->recursiveFunctionCallSequence);
    return;
  }
  return;
}

Assistant:

static void iterateCallSequences (heart::Function& f,
                                      CallSequenceCheckResults& results,
                                      PreviousCall* previous,
                                      uint64_t stackSize)
    {
        calculateLocalVariableStackSize (f);
        stackSize += perCallStackOverhead + f.localVariableStackSize;
        results.maximumStackSize = std::max (results.maximumStackSize, stackSize);

        PreviousCall newPrevious { previous, f };

        if (previous != nullptr && previous->contains (f))
        {
            if (results.recursiveFunctionCallSequence.empty())
                previous->findCallSequenceUpTo (f, results.recursiveFunctionCallSequence);

            return;
        }

        for (auto& b : f.blocks)
            for (auto s : b->statements)
                if (auto call = cast<heart::FunctionCall> (*s))
                    iterateCallSequences (call->getFunction(), results, std::addressof (newPrevious), stackSize);
    }